

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

Result __thiscall
httplib::ClientImpl::Get(ClientImpl *this,char *path,Headers *headers,Progress *progress)

{
  function<bool_(unsigned_long,_unsigned_long)> *__x;
  Error err;
  const_iterator __first;
  type __buf;
  ulong uVar1;
  Progress *__n;
  undefined8 extraout_RDX;
  int in_R8D;
  undefined4 in_register_00000084;
  Result RVar2;
  unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> local_298;
  byte local_289;
  bool ret;
  type res;
  undefined1 local_260 [8];
  Request req;
  Progress *progress_local;
  Headers *headers_local;
  char *path_local;
  ClientImpl *this_local;
  
  __x = (function<bool_(unsigned_long,_unsigned_long)> *)CONCAT44(in_register_00000084,in_R8D);
  __n = progress;
  Request::Request((Request *)local_260);
  std::__cxx11::string::operator=((string *)local_260,"GET");
  std::__cxx11::string::operator=((string *)(req.method.field_2._M_local_buf + 8),(char *)headers);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&req.path.field_2 + 8),
              (multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(path + 0xb8));
  __first = std::
            multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::begin((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)progress);
  res._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)progress);
  std::
  multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::insert<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)(req.path.field_2._M_local_buf + 8),
             (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )__first._M_node,
             (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )res._M_t.
               super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>.
               _M_t.
               super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
               super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl);
  std::function<bool_(unsigned_long,_unsigned_long)>::operator=
            ((function<bool_(unsigned_long,_unsigned_long)> *)&req.content_provider._M_invoker,__x);
  detail::make_unique<httplib::Response>();
  __buf = std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::operator*
                    ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)
                     &stack0xfffffffffffffd78);
  uVar1 = send((ClientImpl *)path,(int)local_260,__buf,(size_t)__n,in_R8D);
  local_289 = (byte)uVar1 & 1;
  if ((uVar1 & 1) == 0) {
    std::unique_ptr<httplib::Response,std::default_delete<httplib::Response>>::
    unique_ptr<std::default_delete<httplib::Response>,void>
              ((unique_ptr<httplib::Response,std::default_delete<httplib::Response>> *)&local_298,
               (nullptr_t)0x0);
  }
  else {
    std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::unique_ptr
              (&local_298,
               (unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)
               &stack0xfffffffffffffd78);
  }
  err = get_last_error((ClientImpl *)path);
  Result::Result((Result *)this,&local_298,err);
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            (&local_298);
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)
             &stack0xfffffffffffffd78);
  Request::~Request((Request *)local_260);
  RVar2._8_8_ = extraout_RDX;
  RVar2.res_._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>.
  _M_t.super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)this;
  return RVar2;
}

Assistant:

inline Result ClientImpl::Get(const char *path, const Headers &headers,
                              Progress progress) {
  Request req;
  req.method = "GET";
  req.path = path;
  req.headers = default_headers_;
  req.headers.insert(headers.begin(), headers.end());
  req.progress = std::move(progress);

  auto res = detail::make_unique<Response>();
  auto ret = send(req, *res);
  return Result{ret ? std::move(res) : nullptr, get_last_error()};
}